

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeF64x2Const
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,array<double,_2UL> *vals)

{
  const_reference pvVar1;
  reference this_00;
  Literal local_d0;
  Result<wasm::Ok> local_b8;
  Literal local_80;
  ulong local_68;
  size_t i;
  array<wasm::Literal,_2UL> lanes;
  array<double,_2UL> *vals_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  lanes._M_elems[1].type.id = (uintptr_t)vals;
  std::array<wasm::Literal,_2UL>::array((array<wasm::Literal,_2UL> *)&i);
  for (local_68 = 0; local_68 < 2; local_68 = local_68 + 1) {
    pvVar1 = std::array<double,_2UL>::operator[]
                       ((array<double,_2UL> *)lanes._M_elems[1].type.id,local_68);
    wasm::Literal::Literal(&local_80,*pvVar1);
    this_00 = std::array<wasm::Literal,_2UL>::operator[]((array<wasm::Literal,_2UL> *)&i,local_68);
    wasm::Literal::operator=(this_00,&local_80);
    wasm::Literal::~Literal(&local_80);
  }
  wasm::Literal::Literal(&local_d0,(LaneArray<2> *)&i);
  IRBuilder::makeConst(&local_b8,&this->irBuilder,&local_d0);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,&local_b8);
  Result<wasm::Ok>::~Result(&local_b8);
  wasm::Literal::~Literal(&local_d0);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&i);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeF64x2Const(Index pos,
                          const std::vector<Annotation>& annotations,
                          const std::array<double, 2>& vals) {
    std::array<Literal, 2> lanes;
    for (size_t i = 0; i < 2; ++i) {
      lanes[i] = Literal(vals[i]);
    }
    return withLoc(pos, irBuilder.makeConst(Literal(lanes)));
  }